

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>::
UntypedPerformAction
          (FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<MockProblemBuilder::MutCommonExpr_&> *pAVar1;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> *in_RDX;
  ArgumentTuple *args;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> action;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> local_28;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> *local_18;
  
  local_18 = in_RDX;
  Action<MockProblemBuilder::MutCommonExpr_&(int)>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<MockProblemBuilder::MutCommonExpr&>::
           PerformAction<MockProblemBuilder::MutCommonExpr&(int)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<MockProblemBuilder::MutCommonExpr_&(int)>::~Action
            ((Action<MockProblemBuilder::MutCommonExpr_&(int)> *)0x2809e1);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }